

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int kinLsPSolve(void *kinmem,N_Vector r,N_Vector z,realtype tol,int lr)

{
  KINLsMem pKStack_48;
  int retval;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  realtype rStack_30;
  int lr_local;
  realtype tol_local;
  N_Vector z_local;
  N_Vector r_local;
  void *kinmem_local;
  
  kin_mem._4_4_ = lr;
  rStack_30 = tol;
  tol_local = (realtype)z;
  z_local = r;
  r_local = (N_Vector)kinmem;
  kinmem_local._4_4_ =
       kinLs_AccessLMem(kinmem,"kinLsPSolve",(KINMem *)&kinls_mem,&stack0xffffffffffffffb8);
  if (kinmem_local._4_4_ == 0) {
    N_VScale(1.0,z_local,(N_Vector)tol_local);
    kinmem_local._4_4_ =
         (*pKStack_48->psolve)
                   ((N_Vector)kinls_mem[1].nps,(N_Vector)kinls_mem[1].last_flag,
                    (N_Vector)kinls_mem[1].njtimes,(N_Vector)kinls_mem[1].pset,(N_Vector)tol_local,
                    pKStack_48->pdata);
    pKStack_48->nps = pKStack_48->nps + 1;
  }
  return kinmem_local._4_4_;
}

Assistant:

int kinLsPSolve(void *kinmem, N_Vector r, N_Vector z, realtype tol, int lr)
{
  KINMem   kin_mem;
  KINLsMem kinls_mem;
  int      retval;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, "kinLsPSolve",
                            &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS)  return(retval);

  /* copy the rhs into z before the psolve call */
  /* Note: z returns with the solution */
  N_VScale(ONE, r, z);

  /* note: user-supplied preconditioning with KINSOL does not
     support either the 'tol' or 'lr' inputs */
  retval = kinls_mem->psolve(kin_mem->kin_uu, kin_mem->kin_uscale,
                             kin_mem->kin_fval, kin_mem->kin_fscale,
                             z, kinls_mem->pdata);
  kinls_mem->nps++;
  return(retval);
}